

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::checkSparseSupport
          (ShaderRenderCaseInstance *this,VkImageType imageType)

{
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  NotSupportedError *this_00;
  VkPhysicalDeviceFeatures deviceFeatures;
  
  vk = getInstanceInterface(this);
  physicalDevice = getPhysicalDevice(this);
  ::vk::getPhysicalDeviceFeatures(&deviceFeatures,vk,physicalDevice);
  if (deviceFeatures.shaderResourceResidency == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Required feature: shaderResourceResidency.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x574);
  }
  else if (deviceFeatures.sparseBinding == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Required feature: sparseBinding.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x577);
  }
  else if ((imageType == VK_IMAGE_TYPE_2D) && (deviceFeatures.sparseResidencyImage2D == 0)) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Required feature: sparseResidencyImage2D.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x57a);
  }
  else {
    if ((imageType != VK_IMAGE_TYPE_3D) || (deviceFeatures.sparseResidencyImage3D != 0)) {
      return;
    }
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Required feature: sparseResidencyImage3D.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x57d);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderRenderCaseInstance::checkSparseSupport (const VkImageType imageType) const
{
	const InstanceInterface&		instance		= getInstanceInterface();
	const VkPhysicalDevice			physicalDevice	= getPhysicalDevice();
	const VkPhysicalDeviceFeatures	deviceFeatures	= getPhysicalDeviceFeatures(instance, physicalDevice);

	if (!deviceFeatures.shaderResourceResidency)
		TCU_THROW(NotSupportedError, "Required feature: shaderResourceResidency.");

	if (!deviceFeatures.sparseBinding)
		TCU_THROW(NotSupportedError, "Required feature: sparseBinding.");

	if (imageType == VK_IMAGE_TYPE_2D && !deviceFeatures.sparseResidencyImage2D)
		TCU_THROW(NotSupportedError, "Required feature: sparseResidencyImage2D.");

	if (imageType == VK_IMAGE_TYPE_3D && !deviceFeatures.sparseResidencyImage3D)
		TCU_THROW(NotSupportedError, "Required feature: sparseResidencyImage3D.");
}